

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_index.cpp
# Opt level: O1

bool __thiscall
MeCab::EncoderFeatureIndex::buildFeature(EncoderFeatureIndex *this,LearnerPath *path)

{
  DictionaryRewriter *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>_>_>
  *this_01;
  int *piVar1;
  bool bVar2;
  ostream *poVar3;
  size_t sVar4;
  StringBuffer *pSVar5;
  iterator iVar6;
  StringBuffer *pSVar7;
  string *lfeature;
  mecab_learner_node_t *__n;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *__buf;
  void *extraout_RDX_03;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  mecab_learner_node_t *__buf_03;
  mecab_learner_node_t *extraout_RDX_04;
  mecab_learner_node_t *extraout_RDX_05;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  char *pcVar8;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>_>,_bool>
  pVar9;
  string key;
  string lfeature2;
  string ufeature2;
  string rfeature1;
  string rfeature2;
  string lfeature1;
  string ufeature1;
  die local_142;
  die local_141;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>
  local_140;
  key_type local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  path->cost = 0.0;
  path->rnode->wcost = 0.0;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  local_d0._M_string_length = 0;
  local_d0.field_2._M_local_buf[0] = '\0';
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  local_f0._M_string_length = 0;
  local_f0.field_2._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_140,path->lnode->feature,(allocator *)&local_110);
  this_00 = &(this->super_FeatureIndex).rewrite_;
  bVar2 = DictionaryRewriter::rewrite2(this_00,&local_140.first,&local_50,&local_70,&local_b0);
  if (!bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
               ,0x73);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x112);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"rewrite_.rewrite2(path->lnode->feature, &ufeature1, &lfeature1, &rfeature1)",
               0x4b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," cannot rewrite pattern: ",0x19);
    pcVar8 = path->lnode->feature;
    if (pcVar8 == (char *)0x0) {
      std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
    }
    else {
      sVar4 = strlen(pcVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar8,sVar4);
    }
    if (!bVar2) {
      die::~die(&local_141);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.first._M_dataplus._M_p != &local_140.first.field_2) {
    operator_delete(local_140.first._M_dataplus._M_p);
  }
  std::__cxx11::string::string((string *)&local_140,path->rnode->feature,(allocator *)&local_110);
  lfeature = &local_f0;
  bVar2 = DictionaryRewriter::rewrite2(this_00,&local_140.first,&local_d0,lfeature,&local_90);
  __buf = extraout_RDX;
  if (!bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
               ,0x73);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x119);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"rewrite_.rewrite2(path->rnode->feature, &ufeature2, &lfeature2, &rfeature2)",
               0x4b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," cannot rewrite pattern: ",0x19);
    pcVar8 = path->rnode->feature;
    if (pcVar8 == (char *)0x0) {
      std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
      __buf = extraout_RDX_01;
    }
    else {
      sVar4 = strlen(pcVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar8,sVar4);
      __buf = extraout_RDX_00;
    }
    if (!bVar2) {
      die::~die(&local_142);
      __buf = extraout_RDX_02;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.first._M_dataplus._M_p != &local_140.first.field_2) {
    operator_delete(local_140.first._M_dataplus._M_p);
    __buf = extraout_RDX_03;
  }
  pSVar7 = &(this->super_FeatureIndex).os_;
  (this->super_FeatureIndex).os_.size_ = 0;
  pSVar5 = (StringBuffer *)
           StringBuffer::write(pSVar7,(int)local_d0._M_dataplus._M_p,__buf,(size_t)lfeature);
  pSVar5 = (StringBuffer *)StringBuffer::write(pSVar5,0x20,__buf_00,(size_t)lfeature);
  __n = path->rnode;
  pSVar5 = (StringBuffer *)
           StringBuffer::write(pSVar5,(int)(char)__n->char_type,__buf_01,(size_t)__n);
  StringBuffer::write(pSVar5,0,__buf_02,(size_t)__n);
  if ((this->super_FeatureIndex).os_.error_ == false) {
    pcVar8 = (this->super_FeatureIndex).os_.ptr_;
  }
  else {
    pcVar8 = (char *)0x0;
  }
  std::__cxx11::string::string((string *)&local_110,pcVar8,(allocator *)&local_140);
  this_01 = &this->feature_cache_;
  iVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>_>_>
                  *)this_01,&local_110);
  if (iVar6._M_node == (_Base_ptr)&this->field_0x1a8) {
    FeatureIndex::buildUnigramFeature(&this->super_FeatureIndex,path,local_d0._M_dataplus._M_p);
    piVar1 = path->rnode->fvector;
    local_140.first._M_dataplus._M_p = (pointer)&local_140.first.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_140,local_110._M_dataplus._M_p,
               local_110._M_dataplus._M_p + local_110._M_string_length);
    local_140.second.second = 1;
    local_140.second.first = piVar1;
    pVar9 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<int_const*,unsigned_long>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::pair<int_const*,unsigned_long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<int_const*,unsigned_long>>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,std::pair<int_const*,unsigned_long>>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<int_const*,unsigned_long>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::pair<int_const*,unsigned_long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<int_const*,unsigned_long>>>>
                        *)this_01,&local_140);
    __buf_03 = pVar9._8_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140.first._M_dataplus._M_p != &local_140.first.field_2) {
      operator_delete(local_140.first._M_dataplus._M_p);
      __buf_03 = extraout_RDX_04;
    }
  }
  else {
    __n = *(mecab_learner_node_t **)(iVar6._M_node + 2);
    __buf_03 = path->rnode;
    __buf_03->fvector = (int *)__n;
    iVar6._M_node[2]._M_parent = (_Base_ptr)((long)&(iVar6._M_node[2]._M_parent)->_M_color + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
    __buf_03 = extraout_RDX_05;
  }
  (this->super_FeatureIndex).os_.size_ = 0;
  pSVar7 = (StringBuffer *)
           StringBuffer::write(pSVar7,(int)local_b0._M_dataplus._M_p,__buf_03,(size_t)__n);
  pSVar7 = (StringBuffer *)StringBuffer::write(pSVar7,0x20,__buf_04,(size_t)__n);
  pSVar7 = (StringBuffer *)
           StringBuffer::write(pSVar7,(int)local_f0._M_dataplus._M_p,__buf_05,(size_t)__n);
  StringBuffer::write(pSVar7,0,__buf_06,(size_t)__n);
  if ((this->super_FeatureIndex).os_.error_ == false) {
    pcVar8 = (this->super_FeatureIndex).os_.ptr_;
  }
  else {
    pcVar8 = (char *)0x0;
  }
  std::__cxx11::string::string((string *)&local_110,pcVar8,(allocator *)&local_140);
  iVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>_>_>
                  *)this_01,&local_110);
  if (iVar6._M_node == (_Base_ptr)&this->field_0x1a8) {
    FeatureIndex::buildBigramFeature
              (&this->super_FeatureIndex,path,local_b0._M_dataplus._M_p,local_f0._M_dataplus._M_p);
    piVar1 = path->fvector;
    local_140.first._M_dataplus._M_p = (pointer)&local_140.first.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_140,local_110._M_dataplus._M_p,
               local_110._M_dataplus._M_p + local_110._M_string_length);
    local_140.second.second = 1;
    local_140.second.first = piVar1;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<int_const*,unsigned_long>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::pair<int_const*,unsigned_long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<int_const*,unsigned_long>>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,std::pair<int_const*,unsigned_long>>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<int_const*,unsigned_long>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::pair<int_const*,unsigned_long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<int_const*,unsigned_long>>>>
                *)this_01,&local_140);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140.first._M_dataplus._M_p != &local_140.first.field_2) {
      operator_delete(local_140.first._M_dataplus._M_p);
    }
  }
  else {
    path->fvector = *(int **)(iVar6._M_node + 2);
    iVar6._M_node[2]._M_parent = (_Base_ptr)((long)&(iVar6._M_node[2]._M_parent)->_M_color + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if (path->fvector == (int *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
               ,0x73);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x145);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"path->fvector",0xd);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," fvector is NULL",0x10);
    die::~die((die *)&local_140);
  }
  if (path->rnode->fvector == (int *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
               ,0x73);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x146);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"path->rnode->fvector",0x14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"fevector is NULL",0x10);
    die::~die((die *)&local_140);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return true;
}

Assistant:

bool EncoderFeatureIndex::buildFeature(LearnerPath *path) {
  path->rnode->wcost = path->cost = 0.0;

  std::string ufeature1;
  std::string lfeature1;
  std::string rfeature1;
  std::string ufeature2;
  std::string lfeature2;
  std::string rfeature2;

  CHECK_DIE(rewrite_.rewrite2(path->lnode->feature,
                              &ufeature1,
                              &lfeature1,
                              &rfeature1))
      << " cannot rewrite pattern: "
      << path->lnode->feature;

  CHECK_DIE(rewrite_.rewrite2(path->rnode->feature,
                              &ufeature2,
                              &lfeature2,
                              &rfeature2))
      << " cannot rewrite pattern: "
      << path->rnode->feature;

  {
    os_.clear();
    os_ << ufeature2 << ' ' << path->rnode->char_type << '\0';
    const std::string key(os_.str());
    std::map<std::string, std::pair<const int *, size_t> >::iterator
        it = feature_cache_.find(key);
    if (it != feature_cache_.end()) {
      path->rnode->fvector = it->second.first;
      it->second.second++;
    } else {
      if (!buildUnigramFeature(path, ufeature2.c_str())) {
        return false;
      }
      feature_cache_.insert(std::pair
                            <std::string, std::pair<const int *, size_t> >
                            (key,
                             std::pair<const int *, size_t>
                             (path->rnode->fvector, 1)));
    }
  }

  {
    os_.clear();
    os_ << rfeature1 << ' ' << lfeature2 << '\0';
    std::string key(os_.str());
    std::map<std::string, std::pair<const int *, size_t> >::iterator
        it = feature_cache_.find(key);
    if (it != feature_cache_.end()) {
      path->fvector = it->second.first;
      it->second.second++;
    } else {
      if (!buildBigramFeature(path, rfeature1.c_str(), lfeature2.c_str()))
        return false;
      feature_cache_.insert(std::pair
                            <std::string, std::pair<const int *, size_t> >
                            (key, std::pair<const int *, size_t>
                             (path->fvector, 1)));
    }
  }

  CHECK_DIE(path->fvector) << " fvector is NULL";
  CHECK_DIE(path->rnode->fvector) << "fevector is NULL";

  return true;
}